

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O1

void eltcalc::GetEventRates(FILE *fin)

{
  int iVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  FILE *pFVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  FILE *outFile;
  ulong uVar7;
  char *pcVar8;
  float extraout_XMM0_Da;
  float in_XMM1_Da;
  float fVar9;
  EventRates row;
  char line [4096];
  char acStack_20e0 [4104];
  FILE *pFStack_10d8;
  code *pcStack_10d0;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 auStack_10b8 [16];
  FILE *pFStack_10a0;
  undefined1 *puStack_1098;
  char *pcStack_1090;
  code *pcStack_1088;
  uint uStack_107c;
  occurrence_granular oStack_1078;
  FILE *pFStack_1068;
  code *pcStack_1060;
  mapped_type local_1050;
  key_type local_1044;
  mapped_type local_1040;
  char local_1038 [4104];
  
  pcStack_1060 = (code *)0x1028d1;
  fgets(local_1038,0x1000,(FILE *)fin);
  pcStack_1060 = (code *)0x1028e1;
  pcVar2 = fgets(local_1038,0x1000,(FILE *)fin);
  if (pcVar2 != (char *)0x0) {
    uVar7 = 2;
    do {
      pcStack_1060 = (code *)0x102918;
      iVar1 = __isoc99_sscanf(local_1038,"%d,%lf",&local_1044,&local_1040);
      if (iVar1 != 2) {
        pcStack_1060 = GetEventRates;
        GetEventRates();
        pcStack_1060 = (code *)event_rate_;
        pcStack_1088 = (code *)0x102995;
        pFStack_1068 = fin;
        pFVar4 = fopen("input/event_rates.csv","r");
        if (pFVar4 != (FILE *)0x0) {
          GetEventRates((FILE *)pFVar4);
          return;
        }
        iVar1 = 0x106062;
        pcStack_1088 = (code *)0x1029bc;
        pFVar4 = fopen("input/occurrence.bin","rb");
        if (pFVar4 != (FILE *)0x0) {
          uStack_107c = 0;
          pcStack_1088 = (code *)0x1029e5;
          fread(&uStack_107c,4,1,pFVar4);
          if (uStack_107c < 2) {
            pcStack_1088 = (code *)0x1029f8;
            GetEventRates<occurrence>((occurrence *)&oStack_1078,(FILE *)pFVar4);
          }
          else {
            pcStack_1088 = (code *)0x102a07;
            GetEventRates<occurrence_granular>(&oStack_1078,(FILE *)pFVar4);
          }
          return;
        }
        pcStack_1088 = GetIntervals;
        GetEventRates();
        pcStack_1090 = "%d,%lf";
        puStack_1098 = event_rate_;
        pcVar8 = "input/quantile.bin";
        pcVar2 = "rb";
        pcStack_10d0 = (code *)0x102a33;
        pFStack_10a0 = fin;
        pcStack_1088 = (code *)uVar7;
        pFVar4 = fopen("input/quantile.bin","rb");
        if (pFVar4 != (FILE *)0x0) {
          pcStack_10d0 = (code *)0x102a56;
          sVar5 = fread(&fStack_10c0,4,1,pFVar4);
          if (sVar5 != 0) {
            fStack_10bc = (float)(iVar1 + -1);
            do {
              fVar9 = fStack_10c0 * fStack_10bc + 1.0;
              auStack_10b8 = ZEXT416((uint)(fVar9 - (float)(int)fVar9));
              pcStack_10d0 = (code *)0x102aa6;
              pmVar6 = std::
                       map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                       ::operator[]((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                                     *)intervals_,&fStack_10c0);
              pmVar6->integer_part = (int)fVar9;
              pmVar6->fractional_part = (float)auStack_10b8._0_4_;
              pcStack_10d0 = (code *)0x102ac7;
              sVar5 = fread(&fStack_10c0,4,1,pFVar4);
            } while (sVar5 != 0);
          }
          pcStack_10d0 = (code *)0x102ad4;
          fclose(pFVar4);
          return;
        }
        pcStack_10d0 = OutputRows;
        GetIntervals();
        pcStack_10d0 = (code *)event_rate_;
        pFStack_10d8 = fin;
        iVar1 = sprintf(acStack_20e0,"%d,%d,%d,%f,%f,%f\n",(double)extraout_XMM0_Da,
                        SUB84((double)in_XMM1_Da,0),(double)*(float *)((long)pcVar8 + 8),
                        (ulong)*(uint *)((long)pcVar8 + 4),(ulong)pcVar2 & 0xffffffff,
                        (ulong)*(uint *)pcVar8);
        WriteOutput(acStack_20e0,iVar1,outFile);
        return;
      }
      local_1050 = local_1040;
      pcStack_1060 = (code *)0x102934;
      pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,&local_1044);
      *pmVar3 = local_1050;
      uVar7 = (ulong)((int)uVar7 + 1);
      pcStack_1060 = (code *)0x102950;
      pcVar2 = fgets(local_1038,0x1000,(FILE *)fin);
    } while (pcVar2 != (char *)0x0);
  }
  pcStack_1060 = (code *)0x10295d;
  fclose((FILE *)fin);
  return;
}

Assistant:

void GetEventRates(FILE * fin)
	{
		// Extract event rates from event rates file
		char line[4096];
		EventRates row;
		fgets(line, sizeof(line), fin);   // Read header
		int lineno = 2;
		while (fgets(line, sizeof(line), fin) != 0) {
			int ret = sscanf(line, "%d,%lf", &row.event_id,
					 &row.event_rate);
			if (ret == 2) {
				event_rate_[row.event_id] = row.event_rate;
			} else {
				fprintf(stderr, "FATAL: Invalid data in line %d:\n%s",
					lineno, line);
				exit(EXIT_FAILURE);
			}
			lineno++;
		}
		fclose(fin);
	}